

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int stMain(int argc,char **argv)

{
  int iVar1;
  err_t code_00;
  char *pcVar2;
  long in_RSI;
  int in_EDI;
  err_t code;
  char **in_stack_00000068;
  int in_stack_00000070;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_EDI < 2) {
    local_4 = stUsage();
  }
  else {
    pcVar2 = (char *)(in_RSI + 8);
    iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      code_00 = stAlg((int)pcVar2,
                      (char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    else {
      iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        code_00 = stRng((int)pcVar2,
                        (char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      }
      else {
        iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
        ;
        if (iVar1 == 0) {
          code_00 = stStamp((int)pcVar2,
                            (char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        }
        else {
          iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ));
          if (iVar1 == 0) {
            code_00 = stCrc(in_stack_00000070,in_stack_00000068);
          }
          else {
            code_00 = 0x259;
          }
        }
      }
    }
    if (((code_00 != 0) ||
        (iVar1 = strCmp(pcVar2,(char *)(ulong)in_stack_ffffffffffffffe8), iVar1 == 0)) ||
       (iVar1 = strCmp(pcVar2,(char *)CONCAT44(code_00,in_stack_ffffffffffffffe8)), iVar1 == 0)) {
      pcVar2 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","st",pcVar2);
    }
    local_4 = 0;
    if (code_00 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int stMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return stUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "alg"))
		code = stAlg(argc - 1, argv + 1);
	else if (strEq(argv[0], "rng"))
		code = stRng(argc - 1, argv + 1);
	else if (strEq(argv[0], "stamp"))
		code = stStamp(argc - 1, argv + 1);
	else if (strEq(argv[0], "crc"))
		code = stCrc(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "alg") || strEq(argv[0], "stamp"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}